

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

double __thiscall ON_Outline::AreaEstimate(ON_Outline *this)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 0.0;
  if ((this->m_figure_type & ~Unknown) != SingleStroke) {
    uVar1 = (this->m_figures).m_count;
    dVar3 = 0.0;
    for (lVar2 = 0; (ulong)uVar1 * 0x48 - lVar2 != 0; lVar2 = lVar2 + 0x48) {
      dVar4 = ON_OutlineFigure::AreaEstimate
                        ((ON_OutlineFigure *)
                         ((long)&((this->m_figures).m_a)->m_units_per_em + lVar2));
      dVar3 = dVar3 + dVar4;
    }
  }
  return dVar3;
}

Assistant:

double ON_Outline::AreaEstimate() const
{
  if (
    ON_OutlineFigure::Type::SingleStroke == m_figure_type
    || ON_OutlineFigure::Type::DoubleStroke == m_figure_type
    )
  {
    return 0.0;
  }

  double outline_area = 0.0;
  const ON__UINT32 figure_count = m_figures.UnsignedCount();
  for (ON__UINT32 i = 0; i < figure_count; i++)
  {
    outline_area += m_figures[i].AreaEstimate();
  }
  return outline_area;
}